

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

box3f * __thiscall pbrt::Object::getBounds(box3f *__return_storage_ptr__,Object *this)

{
  box3f *pbVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  pointer psVar11;
  element_type *peVar12;
  pointer psVar13;
  element_type *peVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  undefined8 uVar19;
  pthread_mutex_t *__mutex;
  shared_ptr<pbrt::Instance> *inst;
  pointer psVar20;
  pointer psVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  box3f ib;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  pthread_mutex_t *local_38;
  
  if (this->haveComputedBounds == true) {
    fVar2 = (this->bounds).upper.z;
    (__return_storage_ptr__->upper).y = (this->bounds).upper.y;
    (__return_storage_ptr__->upper).z = fVar2;
    fVar2 = (this->bounds).lower.y;
    uVar19 = *(undefined8 *)&(this->bounds).lower.z;
    (__return_storage_ptr__->lower).x = (this->bounds).lower.x;
    (__return_storage_ptr__->lower).y = fVar2;
    *(undefined8 *)&(__return_storage_ptr__->lower).z = uVar19;
  }
  else {
    __mutex = (pthread_mutex_t *)&this->mutex;
    iVar18 = pthread_mutex_lock(__mutex);
    if (iVar18 != 0) {
      uVar19 = std::__throw_system_error(iVar18);
      pthread_mutex_unlock(local_38);
      _Unwind_Resume(uVar19);
    }
    pbVar1 = &this->bounds;
    if (this->haveComputedBounds == true) {
      fVar2 = (this->bounds).upper.z;
      (__return_storage_ptr__->upper).y = (this->bounds).upper.y;
      (__return_storage_ptr__->upper).z = fVar2;
      fVar2 = (pbVar1->lower).y;
      uVar19 = *(undefined8 *)&(this->bounds).lower.z;
      (__return_storage_ptr__->lower).x = (pbVar1->lower).x;
      (__return_storage_ptr__->lower).y = fVar2;
      *(undefined8 *)&(__return_storage_ptr__->lower).z = uVar19;
    }
    else {
      (this->bounds).lower.x = 3.4028235e+38;
      (this->bounds).lower.y = 3.4028235e+38;
      *(undefined8 *)&(this->bounds).lower.z = 0xff7fffff7f7fffff;
      (this->bounds).upper.y = -3.4028235e+38;
      (this->bounds).upper.z = -3.4028235e+38;
      psVar20 = (this->instances).
                super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar11 = (this->instances).
                super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      local_38 = __mutex;
      if (psVar20 != psVar11) {
        do {
          peVar12 = (psVar20->super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
          ;
          if (peVar12 != (element_type *)0x0) {
            (*(peVar12->super_Entity)._vptr_Entity[3])(&local_50);
            if (local_50 <= local_44) {
              if (local_4c <= local_40) {
                if (local_48 <= local_3c) {
                  auVar24._4_4_ = local_4c;
                  auVar24._0_4_ = local_50;
                  auVar24._8_8_ = 0;
                  uVar3 = (this->bounds).lower.x;
                  uVar7 = (this->bounds).lower.y;
                  auVar25._4_4_ = uVar7;
                  auVar25._0_4_ = uVar3;
                  auVar25._8_8_ = 0;
                  auVar25 = minps(auVar24,auVar25);
                  uVar4 = (this->bounds).upper.x;
                  uVar8 = (this->bounds).upper.y;
                  auVar15._4_4_ = uVar8;
                  auVar15._0_4_ = uVar4;
                  fVar2 = (this->bounds).lower.z;
                  fVar27 = local_48;
                  if (fVar2 <= local_48) {
                    fVar27 = fVar2;
                  }
                  (this->bounds).lower.x = (float)(int)auVar25._0_8_;
                  (this->bounds).lower.y = (float)(int)((ulong)auVar25._0_8_ >> 0x20);
                  (this->bounds).lower.z = fVar27;
                  auVar22._4_4_ = local_40;
                  auVar22._0_4_ = local_44;
                  auVar22._8_8_ = 0;
                  auVar15._8_8_ = 0;
                  auVar25 = maxps(auVar22,auVar15);
                  fVar2 = (this->bounds).upper.z;
                  fVar27 = local_3c;
                  if (local_3c <= fVar2) {
                    fVar27 = fVar2;
                  }
                  (this->bounds).upper.x = (float)(int)auVar25._0_8_;
                  (this->bounds).upper.y = (float)(int)((ulong)auVar25._0_8_ >> 0x20);
                  (this->bounds).upper.z = fVar27;
                }
              }
            }
          }
          psVar20 = psVar20 + 1;
        } while (psVar20 != psVar11);
      }
      psVar21 = (this->shapes).
                super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar13 = (this->shapes).
                super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (psVar21 != psVar13) {
        do {
          peVar14 = (psVar21->super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          if (peVar14 != (element_type *)0x0) {
            (*(peVar14->super_Entity)._vptr_Entity[6])(&local_50);
            if (local_50 <= local_44) {
              if (local_4c <= local_40) {
                if (local_48 <= local_3c) {
                  auVar26._4_4_ = local_4c;
                  auVar26._0_4_ = local_50;
                  auVar26._8_8_ = 0;
                  uVar5 = (this->bounds).lower.x;
                  uVar9 = (this->bounds).lower.y;
                  auVar16._4_4_ = uVar9;
                  auVar16._0_4_ = uVar5;
                  auVar16._8_8_ = 0;
                  auVar25 = minps(auVar26,auVar16);
                  uVar6 = (this->bounds).upper.x;
                  uVar10 = (this->bounds).upper.y;
                  auVar17._4_4_ = uVar10;
                  auVar17._0_4_ = uVar6;
                  fVar2 = (this->bounds).lower.z;
                  fVar27 = local_48;
                  if (fVar2 <= local_48) {
                    fVar27 = fVar2;
                  }
                  (this->bounds).lower.x = (float)(int)auVar25._0_8_;
                  (this->bounds).lower.y = (float)(int)((ulong)auVar25._0_8_ >> 0x20);
                  (this->bounds).lower.z = fVar27;
                  auVar23._4_4_ = local_40;
                  auVar23._0_4_ = local_44;
                  auVar23._8_8_ = 0;
                  auVar17._8_8_ = 0;
                  auVar25 = maxps(auVar23,auVar17);
                  fVar2 = (this->bounds).upper.z;
                  fVar27 = local_3c;
                  if (local_3c <= fVar2) {
                    fVar27 = fVar2;
                  }
                  (this->bounds).upper.x = (float)(int)auVar25._0_8_;
                  (this->bounds).upper.y = (float)(int)((ulong)auVar25._0_8_ >> 0x20);
                  (this->bounds).upper.z = fVar27;
                }
              }
            }
          }
          psVar21 = psVar21 + 1;
        } while (psVar21 != psVar13);
      }
      this->haveComputedBounds = true;
      fVar2 = (this->bounds).upper.z;
      (__return_storage_ptr__->upper).y = (this->bounds).upper.y;
      (__return_storage_ptr__->upper).z = fVar2;
      fVar2 = (pbVar1->lower).y;
      uVar19 = *(undefined8 *)&(this->bounds).lower.z;
      (__return_storage_ptr__->lower).x = (pbVar1->lower).x;
      (__return_storage_ptr__->lower).y = fVar2;
      *(undefined8 *)&(__return_storage_ptr__->lower).z = uVar19;
      __mutex = local_38;
    }
    pthread_mutex_unlock(__mutex);
  }
  return __return_storage_ptr__;
}

Assistant:

box3f Object::getBounds() 
  {
    if (haveComputedBounds) return bounds;

    std::lock_guard<std::mutex> lock(mutex);
    if (haveComputedBounds) return bounds;
    
    bounds = box3f::empty_box();
    for (auto &inst : instances) {
      if (inst) {
        const box3f ib = inst->getBounds();
        if (!ib.empty())
          bounds.extend(ib);
      }
    }
    for (auto &geom : shapes) {
      if (geom) {
        const box3f gb = geom->getBounds();
        if (!gb.empty())
          bounds.extend(gb);
      }
    }
    haveComputedBounds = true;
    return bounds;
  }